

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score.cc
# Opt level: O3

void __thiscall
xLearn::LinearScore::calc_grad_ftrl
          (LinearScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  uint uVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  real_t *prVar5;
  undefined8 uVar6;
  float fVar7;
  bool bVar8;
  uint uVar9;
  pointer pNVar10;
  pointer pNVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  real_t rVar19;
  undefined1 in_register_00001244 [60];
  undefined1 auVar20 [64];
  
  auVar20._4_60_ = in_register_00001244;
  auVar20._0_4_ = norm;
  if (norm < 0.0) {
    fVar15 = sqrtf(norm);
  }
  else {
    auVar16 = vsqrtss_avx(auVar20._0_16_,auVar20._0_16_);
    fVar15 = auVar16._0_4_;
  }
  pNVar11 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pNVar10 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (pNVar11 != pNVar10) {
    prVar5 = model->param_w_;
    uVar3 = model->num_feat_;
    do {
      uVar4 = pNVar11->feat_id;
      if (uVar4 < uVar3) {
        uVar9 = uVar4 * 3;
        uVar1 = uVar4 * 3 + 1;
        fVar14 = prVar5[uVar1];
        auVar17 = vfmadd231ss_fma(ZEXT416((uint)(pg * pNVar11->feat_val * fVar15)),
                                  ZEXT416((uint)(this->super_Score).lambda_2_),
                                  ZEXT416((uint)prVar5[uVar9]));
        auVar16 = vfmadd213ss_fma(auVar17,auVar17,ZEXT416((uint)fVar14));
        fVar12 = auVar16._0_4_;
        prVar5[uVar1] = fVar12;
        if (fVar12 < 0.0) {
          fVar12 = sqrtf(fVar12);
        }
        else {
          auVar16 = vsqrtss_avx(auVar16,auVar16);
          fVar12 = auVar16._0_4_;
        }
        if (fVar14 < 0.0) {
          fVar14 = sqrtf(fVar14);
        }
        else {
          auVar16 = vsqrtss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
          fVar14 = auVar16._0_4_;
        }
        auVar16._0_4_ = (fVar12 - fVar14) / (this->super_Score).alpha_;
        auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
        uVar4 = uVar4 * 3 + 2;
        auVar16 = vfnmadd231ss_fma(ZEXT416(auVar17._0_4_),auVar16,ZEXT416((uint)prVar5[uVar9]));
        fVar12 = auVar16._0_4_ + prVar5[uVar4];
        auVar17 = ZEXT816(0);
        uVar6 = vcmpss_avx512f(auVar17,ZEXT416((uint)fVar12),1);
        bVar8 = (bool)((byte)uVar6 & 1);
        prVar5[uVar4] = fVar12;
        fVar14 = (this->super_Score).lambda_1_;
        fVar7 = (float)((uint)bVar8 * 0x3f800000 + (uint)!bVar8 * -0x40800000);
        if (fVar14 < fVar12 * fVar7) {
          fVar13 = prVar5[uVar1];
          fVar2 = (this->super_Score).beta_;
          if (fVar13 < 0.0) {
            fVar13 = sqrtf(fVar13);
          }
          else {
            auVar16 = vsqrtss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13));
            fVar13 = auVar16._0_4_;
          }
          auVar16 = vfmsub213ss_fma(ZEXT416((uint)fVar14),ZEXT416((uint)fVar7),ZEXT416((uint)fVar12)
                                   );
          auVar17._0_4_ =
               auVar16._0_4_ /
               ((fVar2 + fVar13) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
          auVar17._4_12_ = auVar16._4_12_;
        }
        prVar5[uVar9] = auVar17._0_4_;
        pNVar10 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      pNVar11 = pNVar11 + 1;
    } while (pNVar11 != pNVar10);
  }
  prVar5 = model->param_b_;
  fVar15 = prVar5[1];
  auVar16 = vfmadd213ss_fma(ZEXT416((uint)pg),ZEXT416((uint)pg),ZEXT416((uint)fVar15));
  fVar14 = auVar16._0_4_;
  prVar5[1] = fVar14;
  if (fVar14 < 0.0) {
    fVar14 = sqrtf(fVar14);
  }
  else {
    auVar16 = vsqrtss_avx(auVar16,auVar16);
    fVar14 = auVar16._0_4_;
  }
  if (fVar15 < 0.0) {
    fVar15 = sqrtf(fVar15);
  }
  else {
    auVar16 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
    fVar15 = auVar16._0_4_;
  }
  auVar18._0_4_ = (fVar14 - fVar15) / (this->super_Score).alpha_;
  auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar16 = vfnmadd231ss_fma(ZEXT416((uint)pg),auVar18,ZEXT416((uint)*prVar5));
  fVar14 = auVar16._0_4_ + prVar5[2];
  rVar19 = 0.0;
  uVar6 = vcmpss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)fVar14),1);
  bVar8 = (bool)((byte)uVar6 & 1);
  prVar5[2] = fVar14;
  fVar15 = (this->super_Score).lambda_1_;
  fVar12 = (float)((uint)bVar8 * 0x3f800000 + (uint)!bVar8 * -0x40800000);
  if (fVar15 < fVar14 * fVar12) {
    auVar16 = vfmsub213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)fVar12),ZEXT416((uint)fVar14));
    fVar15 = prVar5[1];
    fVar14 = (this->super_Score).beta_;
    if (fVar15 < 0.0) {
      fVar15 = sqrtf(fVar15);
    }
    else {
      auVar17 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
      fVar15 = auVar17._0_4_;
    }
    rVar19 = auVar16._0_4_ /
             ((fVar14 + fVar15) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
  }
  *prVar5 = rVar19;
  return;
}

Assistant:

void LinearScore::calc_grad_ftrl(const SparseRow* row,
                                 Model& model,
                                 real_t pg,
                                 real_t norm) {
  // linear term
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }
}